

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

uint32_t duckdb::ParquetCrypto::Write
                   (TBase *object,TProtocol *oprot,string *key,EncryptionUtil *encryption_util_p)

{
  element_type *this;
  uint32_t uVar1;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> eprot;
  TCompactProtocolFactoryT<duckdb::EncryptionTransport> tproto_factory;
  undefined1 local_58 [16];
  shared_ptr<duckdb_apache::thrift::transport::TTransport> local_48;
  __shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_48.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR__TProtocolFactory_027e3d80;
  local_48.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  make_shared<duckdb::EncryptionTransport,duckdb_apache::thrift::protocol::TProtocol&,std::__cxx11::string_const&,duckdb::EncryptionUtil_const&>
            ((TProtocol *)&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oprot,
             (EncryptionUtil *)key);
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_ptr;
  _Stack_20._M_pi = local_38._M_refcount._M_pi;
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::EncryptionTransport>::
  getProtocol((TCompactProtocolFactoryT<duckdb::EncryptionTransport> *)local_58,&local_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  ::std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_38,
               (__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                *)(local_58._0_8_ + 8));
  this = local_38._M_ptr;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  (*object->_vptr_TBase[3])(object,local_58._0_8_);
  uVar1 = EncryptionTransport::Finalize((EncryptionTransport *)this);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  duckdb_apache::thrift::protocol::TProtocolFactory::~TProtocolFactory
            ((TProtocolFactory *)&local_48);
  return uVar1;
}

Assistant:

uint32_t ParquetCrypto::Write(const TBase &object, TProtocol &oprot, const string &key,
                              const EncryptionUtil &encryption_util_p) {
	// Create encryption protocol
	TCompactProtocolFactoryT<EncryptionTransport> tproto_factory;
	auto eprot = tproto_factory.getProtocol(std::make_shared<EncryptionTransport>(oprot, key, encryption_util_p));
	auto &etrans = reinterpret_cast<EncryptionTransport &>(*eprot->getTransport());

	// Write the object in memory
	object.write(eprot.get());

	// Encrypt and write to oprot
	return etrans.Finalize();
}